

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeginningWithTests.cpp
# Opt level: O2

void __thiscall
IsNotStringBeginningWithTests::~IsNotStringBeginningWithTests(IsNotStringBeginningWithTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("string not BeginningWith desired string is true", [&]() {
			AssertThat(ut11::Is::String::Not::BeginningWith("Wor")("AvsdaWoroasdagf"), ut11::Is::True);
		});

		Then("string BeginningWith desired string is false", [&]() {
			AssertThat(ut11::Is::String::Not::BeginningWith("Wor")("World"), ut11::Is::False);
		});

		Then("AssertThat using Not BeginningWith works as expected", [&]() {
			AssertThat("Pianos and Pies", ut11::Is::String::Not::BeginningWith("Pies"));
		});

		Then("Is::Not::String::BeginningWith is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::String::Not::BeginningWith("world")) >::value, ut11::Is::True);
		});

		Then("Is::Not::String::BeginningWith has an error message", []() {
			AssertThat(ut11::Is::String::Not::BeginningWith("world").GetErrorMessage("world"), ut11::Is::Not::EqualTo(""));
		});
	}